

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Own<kj::HttpClient,_std::nullptr_t> __thiscall
kj::newHttpClient(kj *this,Timer *timer,HttpHeaderTable *responseHeaderTable,Network *network,
                 Maybe<kj::Network_&> *tlsNetwork,HttpClientSettings *settings)

{
  Network *pNVar1;
  SourceLocation location;
  Maybe<kj::EntropySource_&> MVar2;
  Maybe<kj::HttpClientErrorHandler_&> MVar3;
  Maybe<kj::WebSocketErrorHandler_&> MVar4;
  undefined8 *puVar5;
  HttpClient *extraout_RDX;
  Own<kj::HttpClient,_std::nullptr_t> OVar6;
  HttpClientSettings local_60;
  
  puVar5 = (undefined8 *)operator_new(0xf8);
  pNVar1 = tlsNetwork->ptr;
  HttpClientSettings::HttpClientSettings(&local_60,settings);
  MVar4.ptr = local_60.webSocketErrorHandler.ptr;
  MVar3.ptr = local_60.errorHandler.ptr;
  MVar2.ptr = local_60.entropySource.ptr;
  *puVar5 = &PTR_request_005929d8;
  puVar5[1] = &DAT_00592a08;
  puVar5[2] = timer;
  puVar5[3] = responseHeaderTable;
  puVar5[4] = network;
  local_60.entropySource.ptr = (EntropySource *)0x0;
  puVar5[5] = pNVar1;
  local_60.errorHandler.ptr = (HttpClientErrorHandler *)0x0;
  puVar5[6] = local_60.idleTimeout.value;
  puVar5[7] = MVar2.ptr;
  puVar5[8] = MVar3.ptr;
  *(WebSocketCompressionMode *)(puVar5 + 9) = local_60.webSocketCompressionMode;
  local_60.webSocketErrorHandler.ptr = (WebSocketErrorHandler *)0x0;
  puVar5[10] = MVar4.ptr;
  puVar5[0xb] = local_60.tlsContext.ptr;
  local_60.tlsContext.ptr = (SecureNetworkWrapper *)0x0;
  *(undefined4 *)(puVar5 + 0xd) = 0;
  puVar5[0xe] = 0;
  puVar5[0xf] = puVar5 + 0xd;
  puVar5[0x10] = puVar5 + 0xd;
  puVar5[0x11] = 0;
  *(undefined4 *)(puVar5 + 0x13) = 0;
  puVar5[0x14] = 0;
  puVar5[0x15] = puVar5 + 0x13;
  puVar5[0x16] = puVar5 + 0x13;
  puVar5[0x17] = 0;
  location.function = "NetworkHttpClient";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x188b;
  location.columnNumber = 9;
  TaskSet::TaskSet((TaskSet *)(puVar5 + 0x18),(ErrorHandler *)(puVar5 + 1),location);
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::NetworkHttpClient>::instance;
  *(undefined8 **)(this + 8) = puVar5;
  OVar6.ptr = extraout_RDX;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

kj::Own<HttpClient> newHttpClient(kj::Timer& timer, const HttpHeaderTable& responseHeaderTable,
                                  kj::Network& network, kj::Maybe<kj::Network&> tlsNetwork,
                                  HttpClientSettings settings) {
  return kj::heap<NetworkHttpClient>(
      timer, responseHeaderTable, network, tlsNetwork, kj::mv(settings));
}